

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotBuffer.cpp
# Opt level: O1

void __thiscall cali::SnapshotBuffer::append(SnapshotBuffer *this,CompressedSnapshotRecord *rec)

{
  uchar *puVar1;
  ulong uVar2;
  
  uVar2 = rec->m_imm_len + rec->m_imm_pos;
  if (rec->m_buffer_len < uVar2) {
    uVar2 = rec->m_buffer_len;
  }
  puVar1 = reserve(this,uVar2 + this->m_pos);
  uVar2 = rec->m_imm_len + rec->m_imm_pos;
  if (rec->m_buffer_len < uVar2) {
    uVar2 = rec->m_buffer_len;
  }
  memcpy(puVar1 + this->m_pos,rec->m_buffer,uVar2);
  uVar2 = rec->m_imm_len + rec->m_imm_pos;
  if (rec->m_buffer_len < uVar2) {
    uVar2 = rec->m_buffer_len;
  }
  this->m_pos = this->m_pos + uVar2;
  this->m_count = this->m_count + 1;
  return;
}

Assistant:

void SnapshotBuffer::append(const CompressedSnapshotRecord& rec)
{
    memcpy(reserve(m_pos + rec.size()) + m_pos, rec.data(), rec.size());

    m_pos += rec.size();
    ++m_count;
}